

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall kratos::DependencyVisitor::visit(DependencyVisitor *this,Generator *generator)

{
  int iVar1;
  pointer psVar2;
  pointer psVar3;
  long lVar4;
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::AssignStmt> assign;
  
  psVar2 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar3 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  do {
    if ((long)psVar2 - (long)psVar3 >> 4 == lVar4) {
      return;
    }
    Generator::get_stmt((Generator *)local_60,(uint32_t)generator);
    iVar1 = *(int *)(local_60._0_8_ + 0x78);
    if (iVar1 == 5) {
      Stmt::as<kratos::ModuleInstantiationStmt>((Stmt *)local_40);
      visit_module_instantiation(this,(ModuleInstantiationStmt *)local_40);
LAB_001e390c:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&assign);
    }
    else {
      if (iVar1 == 4) {
        Stmt::as<kratos::StmtBlock>((Stmt *)local_40);
        iVar1 = *(int *)&(((InstantiationStmt *)((long)local_40 + 0xc0))->port_mapping_)._M_t.
                         _M_impl.super__Rb_tree_header._M_header._M_parent;
        if (iVar1 == 0) {
          Stmt::as<kratos::CombinationalStmtBlock>((Stmt *)(local_60 + 0x10));
          visit_block(this,(CombinationalStmtBlock *)local_60._16_8_);
        }
        else {
          if (iVar1 != 1) goto LAB_001e390c;
          Stmt::as<kratos::SequentialStmtBlock>((Stmt *)(local_60 + 0x10));
          visit_block(this,(SequentialStmtBlock *)local_60._16_8_);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
        goto LAB_001e390c;
      }
      if (iVar1 == 3) {
        Stmt::as<kratos::AssignStmt>((Stmt *)local_40);
        visit_assign(this,(AssignStmt *)local_40);
        goto LAB_001e390c;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void visit(Generator *generator) override {
        // visit the top and find out top level assignments
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto const &stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign = stmt->as<AssignStmt>();
                visit_assign(assign.get());
            } else if (stmt->type() == StatementType::Block) {
                auto block = stmt->as<StmtBlock>();
                if (block->block_type() == StatementBlockType::Sequential) {
                    visit_block(block->as<SequentialStmtBlock>().get());
                } else if (block->block_type() == StatementBlockType::Combinational) {
                    visit_block(block->as<CombinationalStmtBlock>().get());
                }
            } else if (stmt->type() == StatementType::ModuleInstantiation) {
                visit_module_instantiation(stmt->as<ModuleInstantiationStmt>().get());
            }
        }
    }